

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
* __thiscall
bhf::ads::SymbolEntry::Parse_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
           *__return_storage_ptr__,SymbolEntry *this,uint8_t *data,size_t lengthLimit)

{
  ostream *poVar1;
  void *pvVar2;
  AdsException *pAVar3;
  char *pcVar4;
  ulong uVar5;
  allocator local_971;
  string local_970 [32];
  string local_950 [32];
  stringstream local_930 [8];
  stringstream stream_4;
  ostream local_920 [383];
  allocator local_7a1;
  string local_7a0 [32];
  string local_780 [32];
  stringstream local_760 [8];
  stringstream stream_3;
  ostream local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  string local_5b0 [32];
  stringstream local_590 [8];
  stringstream stream_2;
  ostream local_580 [376];
  string local_408 [32];
  stringstream local_3e8 [8];
  stringstream stream_1;
  ostream local_3d8 [376];
  undefined1 local_260 [8];
  SymbolEntry entry;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  SymbolEntry *local_28;
  AdsSymbolEntry *pHeader;
  size_t lengthLimit_local;
  uint8_t *data_local;
  
  local_28 = this;
  pHeader = (AdsSymbolEntry *)data;
  lengthLimit_local = (size_t)this;
  data_local = (uint8_t *)__return_storage_ptr__;
  if (data < (uint8_t *)0x1e) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar1 = std::operator<<(local_1a0,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Read data to short to contain symbol info: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(ulong)pHeader);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,(string *)&entry.field_0x78);
    std::__cxx11::string::~string((string *)&entry.field_0x78);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,0x706);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  SymbolEntry((SymbolEntry *)local_260);
  local_260._0_4_ = letoh<unsigned_int>((uint *)local_28);
  local_260._4_4_ = letoh<unsigned_int>(&(local_28->header).iGroup);
  entry.header.entryLength = letoh<unsigned_int>(&(local_28->header).iOffs);
  entry.header.iGroup = letoh<unsigned_int>(&(local_28->header).size);
  entry.header.iOffs = letoh<unsigned_int>(&(local_28->header).dataType);
  entry.header.size = letoh<unsigned_int>(&(local_28->header).flags);
  entry.header.dataType._0_2_ = letoh<unsigned_short>(&(local_28->header).nameLength);
  entry.header.dataType._2_2_ = letoh<unsigned_short>(&(local_28->header).typeLength);
  entry.header.flags._0_2_ = letoh<unsigned_short>(&(local_28->header).commentLength);
  if (pHeader < (AdsSymbolEntry *)(ulong)(uint)local_260._0_4_) {
    std::__cxx11::stringstream::stringstream(local_3e8);
    poVar1 = std::operator<<(local_3d8,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt entry length: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,local_260._0_4_);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_408);
    std::__cxx11::string::~string((string *)local_408);
    std::__cxx11::stringstream::~stringstream(local_3e8);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,0x706);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  pHeader = (AdsSymbolEntry *)((ulong)(uint)local_260._0_4_ - 0x1e);
  pcVar4 = (char *)(lengthLimit_local + 0x1e);
  lengthLimit_local = (size_t)pcVar4;
  if ((ulong)(uint)local_260._0_4_ - 0x1f < (ulong)(unsigned_short)entry.header.dataType) {
    std::__cxx11::stringstream::stringstream(local_590);
    poVar1 = std::operator<<(local_580,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt nameLength: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(unsigned_short)entry.header.dataType);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_5b0);
    std::__cxx11::string::~string((string *)local_5b0);
    std::__cxx11::stringstream::~stringstream(local_590);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,0x706);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  uVar5 = (ulong)(unsigned_short)entry.header.dataType;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d0,pcVar4,uVar5,&local_5d1);
  std::__cxx11::string::operator=((string *)&entry.header.nameLength,local_5d0);
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  pHeader = (AdsSymbolEntry *)
            ((long)pHeader - (long)(int)((unsigned_short)entry.header.dataType + 1));
  pcVar4 = (char *)(lengthLimit_local + (long)(int)((unsigned_short)entry.header.dataType + 1));
  lengthLimit_local = (size_t)pcVar4;
  if ((undefined1 *)((long)&pHeader[-1].commentLength + 1U) <
      (undefined1 *)(ulong)entry.header.dataType._2_2_) {
    std::__cxx11::stringstream::stringstream(local_760);
    poVar1 = std::operator<<(local_750,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt typeLength: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,entry.header.dataType._2_2_);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_780);
    std::__cxx11::string::~string((string *)local_780);
    std::__cxx11::stringstream::~stringstream(local_760);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,0x706);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  uVar5 = (ulong)entry.header.dataType._2_2_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7a0,pcVar4,uVar5,&local_7a1);
  std::__cxx11::string::operator=((string *)&entry.field_0x38,local_7a0);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
  pHeader = (AdsSymbolEntry *)((long)pHeader - (long)(int)(entry.header.dataType._2_2_ + 1));
  pcVar4 = (char *)(lengthLimit_local + (long)(int)(entry.header.dataType._2_2_ + 1));
  lengthLimit_local = (size_t)pcVar4;
  if ((undefined1 *)((long)&pHeader[-1].commentLength + 1U) <
      (undefined1 *)(ulong)(unsigned_short)entry.header.flags) {
    std::__cxx11::stringstream::stringstream(local_930);
    poVar1 = std::operator<<(local_920,"Parse");
    poVar1 = std::operator<<(poVar1,"(): Corrupt commentLength: ");
    pvVar2 = (void *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = (ostream *)std::ostream::operator<<(pvVar2,(unsigned_short)entry.header.flags);
    std::operator<<(poVar1,'\n');
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_950);
    std::__cxx11::string::~string((string *)local_950);
    std::__cxx11::stringstream::~stringstream(local_930);
    pAVar3 = (AdsException *)__cxa_allocate_exception(0x30);
    AdsException::AdsException(pAVar3,0x706);
    __cxa_throw(pAVar3,&AdsException::typeinfo,AdsException::~AdsException);
  }
  uVar5 = (ulong)(unsigned_short)entry.header.flags;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_970,pcVar4,uVar5,&local_971);
  std::__cxx11::string::operator=((string *)&entry.field_0x58,local_970);
  std::__cxx11::string::~string(local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bhf::ads::SymbolEntry>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bhf::ads::SymbolEntry_&,_true>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &entry.header.nameLength,(SymbolEntry *)local_260);
  ~SymbolEntry((SymbolEntry *)local_260);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, SymbolEntry> SymbolEntry::Parse(const uint8_t* data, size_t lengthLimit)
{
    const auto pHeader = reinterpret_cast<const AdsSymbolEntry*>(data);
    if (sizeof(*pHeader) > lengthLimit) {
        LOG_ERROR(__FUNCTION__ << "(): Read data to short to contain symbol info: " << std::dec << lengthLimit << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    SymbolEntry entry;
    entry.header.entryLength = letoh(pHeader->entryLength);
    entry.header.iGroup = letoh(pHeader->iGroup);
    entry.header.iOffs = letoh(pHeader->iOffs);
    entry.header.size = letoh(pHeader->size);
    entry.header.dataType = letoh(pHeader->dataType);
    entry.header.flags = letoh(pHeader->flags);
    entry.header.nameLength = letoh(pHeader->nameLength);
    entry.header.typeLength = letoh(pHeader->typeLength);
    entry.header.commentLength = letoh(pHeader->commentLength);

    if (entry.header.entryLength > lengthLimit) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt entry length: " << std::dec << entry.header.entryLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    lengthLimit = entry.header.entryLength - sizeof(entry.header);
    data += sizeof(entry.header);

    if (entry.header.nameLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt nameLength: " << std::dec << entry.header.nameLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.name = std::string(reinterpret_cast<const char*>(data), entry.header.nameLength);
    lengthLimit -= entry.header.nameLength + 1;
    data += entry.header.nameLength + 1;

    if (entry.header.typeLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt typeLength: " << std::dec << entry.header.typeLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.typeName = std::string(reinterpret_cast<const char*>(data), entry.header.typeLength);
    lengthLimit -= entry.header.typeLength + 1;
    data += entry.header.typeLength + 1;

    if (entry.header.commentLength > lengthLimit - 1) {
        LOG_ERROR(
            __FUNCTION__ << "(): Corrupt commentLength: " << std::dec << entry.header.commentLength << '\n');
        throw AdsException(ADSERR_DEVICE_INVALIDDATA);
    }
    entry.comment = std::string(reinterpret_cast<const char*>(data), entry.header.commentLength);
    return {entry.name, entry};
}